

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O1

void vkt::texture::anon_unknown_0::populateTextureShadowTests(TestCaseGroup *textureShadowTests)

{
  undefined4 uVar1;
  TestContext *testCtx;
  undefined4 uVar3;
  char *pcVar2;
  void *pvVar4;
  long *plVar5;
  TestNode *pTVar6;
  long lVar7;
  _func_int **pp_Var8;
  long *plVar9;
  long lVar10;
  long lVar11;
  string name;
  Texture2DShadowTestCaseParameters testParameters;
  allocator<char> local_121;
  TestNode *local_120;
  TestNode *local_118;
  undefined4 local_110;
  undefined4 uStack_10c;
  long local_100 [2];
  TestNode *local_f0;
  TestContext *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  undefined1 local_c0 [12];
  FilterMode FStack_b4;
  undefined8 local_b0;
  VkFormat VStack_a8;
  undefined4 uStack_a4;
  undefined1 auStack_a0 [16];
  iterator local_90;
  Program *local_88;
  size_type local_80;
  undefined4 local_78;
  long *local_70 [2];
  long local_60 [2];
  long local_50;
  long local_48;
  anon_struct_16_2_e828d30f *local_40;
  TestNode *local_38;
  
  testCtx = (textureShadowTests->super_TestNode).m_testCtx;
  local_38 = &textureShadowTests->super_TestNode;
  local_120 = (TestNode *)operator_new(0x70);
  local_e8 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_120,testCtx,"2d","2D texture shadow lookup tests");
  lVar11 = 0;
  do {
    local_f0 = (TestNode *)operator_new(0x70);
    local_50 = lVar11;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_f0,local_e8,populateTextureShadowTests::filters[lVar11].name,
               "");
    lVar7 = 0;
    do {
      local_118 = (TestNode *)(populateTextureShadowTests::compareOp + lVar7);
      local_40 = (anon_struct_16_2_e828d30f *)populateTextureShadowTests::compareOp[lVar7].name;
      lVar10 = 8;
      local_48 = lVar7;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,(char *)local_40,(allocator<char> *)local_70);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_c0._0_8_ = &local_b0;
        pp_Var8 = (_func_int **)(plVar5 + 2);
        if ((_func_int **)*plVar5 == pp_Var8) {
          local_b0._0_4_ = (WrapMode)*pp_Var8;
          local_b0._4_4_ = (WrapMode)((ulong)*pp_Var8 >> 0x20);
          VStack_a8 = (VkFormat)plVar5[3];
          uStack_a4 = (undefined4)((ulong)plVar5[3] >> 0x20);
        }
        else {
          local_b0._0_4_ = (WrapMode)*pp_Var8;
          local_b0._4_4_ = (WrapMode)((ulong)*pp_Var8 >> 0x20);
          local_c0._0_8_ = (_func_int **)*plVar5;
        }
        local_c0._8_4_ = (undefined4)plVar5[1];
        FStack_b4 = (FilterMode)((ulong)plVar5[1] >> 0x20);
        *plVar5 = (long)pp_Var8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append(local_c0);
        local_e0 = &local_d0;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_d0 = *plVar9;
          lStack_c8 = plVar5[3];
        }
        else {
          local_d0 = *plVar9;
          local_e0 = (long *)*plVar5;
        }
        local_d8 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((undefined8 *)local_c0._0_8_ != &local_b0) {
          operator_delete((void *)local_c0._0_8_,CONCAT44(local_b0._4_4_,(WrapMode)local_b0) + 1);
        }
        if ((long *)CONCAT44(uStack_10c,local_110) != local_100) {
          operator_delete((long *)CONCAT44(uStack_10c,local_110),local_100[0] + 1);
        }
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)local_c0);
        uVar1 = populateTextureShadowTests::filters[lVar11].minFilter;
        uVar3 = populateTextureShadowTests::filters[lVar11].magFilter;
        VStack_a8 = *(VkFormat *)((long)&populateTextureShadowTests::formats[0].name + lVar10);
        local_80 = CONCAT44(local_80._4_4_,*(CompareMode *)&local_118->m_testCtx);
        local_b0._0_4_ = REPEAT_GL;
        local_b0._4_4_ = REPEAT_GL;
        local_88 = (Program *)0x4000000020;
        local_110 = 3;
        local_c0._8_4_ = uVar1;
        FStack_b4 = uVar3;
        if ((Program *)auStack_a0._8_8_ == local_90._M_current) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)auStack_a0,(iterator)auStack_a0._8_8_,(Program *)&local_110);
        }
        else {
          *(Program *)auStack_a0._8_8_ = PROGRAM_2D_SHADOW;
          auStack_a0._8_8_ = auStack_a0._8_8_ + 4;
        }
        pTVar6 = (TestNode *)operator_new(0xb8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,(char *)local_e0,&local_121);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar6,local_e8,(char *)CONCAT44(uStack_10c,local_110),
                   (char *)local_70[0]);
        pTVar6->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67fb0;
        pTVar6[1]._vptr_TestNode = (_func_int **)local_c0._0_8_;
        pTVar6[1].m_testCtx = (TestContext *)CONCAT44(FStack_b4,local_c0._8_4_);
        *(ulong *)((long)&pTVar6[1].m_testCtx + 4) = CONCAT44((WrapMode)local_b0,FStack_b4);
        *(ulong *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(VStack_a8,local_b0._4_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar6[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               auStack_a0);
        pTVar6[1].m_description._M_string_length = (size_type)local_88;
        *(undefined4 *)&pTVar6[1].m_description.field_2 = (undefined4)local_80;
        tcu::TestNode::addChild(local_f0,pTVar6);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if ((long *)CONCAT44(uStack_10c,local_110) != local_100) {
          operator_delete((long *)CONCAT44(uStack_10c,local_110),local_100[0] + 1);
        }
        pvVar4 = (void *)CONCAT44(auStack_a0._4_4_,auStack_a0._0_4_);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,(long)local_90._M_current - (long)pvVar4);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,local_d0 + 1);
        }
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x68);
      lVar7 = local_48 + 1;
    } while (lVar7 != 8);
    tcu::TestNode::addChild(local_120,local_f0);
    lVar11 = local_50 + 1;
  } while (lVar11 != 6);
  tcu::TestNode::addChild(local_38,local_120);
  local_120 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_120,local_e8,"cube","Cube map texture shadow lookup tests");
  lVar11 = 0;
  do {
    local_118 = (TestNode *)operator_new(0x70);
    local_50 = lVar11;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_118,local_e8,populateTextureShadowTests::filters[lVar11].name,
               "");
    local_f0 = (TestNode *)(populateTextureShadowTests::filters + lVar11);
    lVar11 = 0;
    do {
      local_40 = populateTextureShadowTests::compareOp + lVar11;
      pcVar2 = populateTextureShadowTests::compareOp[lVar11].name;
      lVar7 = 8;
      local_48 = lVar11;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,pcVar2,(allocator<char> *)local_70);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_b0._0_4_ = (WrapMode)*plVar9;
          local_b0._4_4_ = (WrapMode)((ulong)*plVar9 >> 0x20);
          VStack_a8 = (VkFormat)plVar5[3];
          uStack_a4 = (undefined4)((ulong)plVar5[3] >> 0x20);
          local_c0._0_8_ = &local_b0;
        }
        else {
          local_b0._0_4_ = (WrapMode)*plVar9;
          local_b0._4_4_ = (WrapMode)((ulong)*plVar9 >> 0x20);
          local_c0._0_8_ = (long *)*plVar5;
        }
        local_c0._8_4_ = (undefined4)plVar5[1];
        FStack_b4 = (FilterMode)((ulong)plVar5[1] >> 0x20);
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append(local_c0);
        local_e0 = &local_d0;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_d0 = *plVar9;
          lStack_c8 = plVar5[3];
        }
        else {
          local_d0 = *plVar9;
          local_e0 = (long *)*plVar5;
        }
        local_d8 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((undefined8 *)local_c0._0_8_ != &local_b0) {
          operator_delete((void *)local_c0._0_8_,CONCAT44(local_b0._4_4_,(WrapMode)local_b0) + 1);
        }
        if ((long *)CONCAT44(uStack_10c,local_110) != local_100) {
          operator_delete((long *)CONCAT44(uStack_10c,local_110),local_100[0] + 1);
        }
        local_c0._0_4_ = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_1_BIT;
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)(local_c0 + 8));
        local_b0._0_4_ = (WrapMode)local_f0->m_testCtx;
        local_b0._4_4_ = (WrapMode)((ulong)local_f0->m_testCtx >> 0x20);
        auStack_a0._0_4_ =
             *(undefined4 *)((long)&populateTextureShadowTests::formats[0].name + lVar7);
        local_c0._0_4_ = local_40->op;
        VStack_a8 = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
        uStack_a4 = 2;
        local_80 = CONCAT44(local_80._4_4_,0x20);
        local_110 = 0x13;
        if (local_90._M_current == local_88) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(auStack_a0 + 8),local_90,(Program *)&local_110);
        }
        else {
          *local_90._M_current = PROGRAM_CUBE_SHADOW;
          local_90._M_current = local_90._M_current + 1;
        }
        pTVar6 = (TestNode *)operator_new(0xb8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,(char *)local_e0,&local_121);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar6,local_e8,(char *)CONCAT44(uStack_10c,local_110),
                   (char *)local_70[0]);
        pTVar6->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d68050;
        *(undefined4 *)&pTVar6[1]._vptr_TestNode = local_c0._0_4_;
        pTVar6[1].m_testCtx = (TestContext *)CONCAT44(FStack_b4,local_c0._8_4_);
        pTVar6[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(local_b0._4_4_,(WrapMode)local_b0);
        *(ulong *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(VStack_a8,local_b0._4_4_);
        *(ulong *)((long)&pTVar6[1].m_name._M_string_length + 4) =
             CONCAT44(auStack_a0._0_4_,uStack_a4);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               ((long)&pTVar6[1].m_name.field_2 + 8),
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (auStack_a0 + 8));
        *(undefined4 *)&pTVar6[1].m_description.field_2 = (undefined4)local_80;
        tcu::TestNode::addChild(local_118,pTVar6);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if ((long *)CONCAT44(uStack_10c,local_110) != local_100) {
          operator_delete((long *)CONCAT44(uStack_10c,local_110),local_100[0] + 1);
        }
        if ((Program *)auStack_a0._8_8_ != (Program *)0x0) {
          operator_delete((void *)auStack_a0._8_8_,(long)local_88 - auStack_a0._8_8_);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,local_d0 + 1);
        }
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x68);
      lVar11 = local_48 + 1;
    } while (lVar11 != 8);
    tcu::TestNode::addChild(local_120,local_118);
    lVar11 = local_50 + 1;
  } while (lVar11 != 6);
  tcu::TestNode::addChild(local_38,local_120);
  local_120 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_120,local_e8,"2d_array","2D texture array shadow lookup tests");
  lVar11 = 0;
  do {
    local_118 = (TestNode *)operator_new(0x70);
    local_50 = lVar11;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_118,local_e8,populateTextureShadowTests::filters[lVar11].name,
               "");
    local_f0 = (TestNode *)(populateTextureShadowTests::filters + lVar11);
    lVar11 = 0;
    do {
      local_40 = populateTextureShadowTests::compareOp + lVar11;
      pcVar2 = populateTextureShadowTests::compareOp[lVar11].name;
      lVar7 = 8;
      local_48 = lVar11;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,pcVar2,(allocator<char> *)local_70);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_b0._0_4_ = (WrapMode)*plVar9;
          local_b0._4_4_ = (WrapMode)((ulong)*plVar9 >> 0x20);
          VStack_a8 = (VkFormat)plVar5[3];
          uStack_a4 = (undefined4)((ulong)plVar5[3] >> 0x20);
          local_c0._0_8_ = &local_b0;
        }
        else {
          local_b0._0_4_ = (WrapMode)*plVar9;
          local_b0._4_4_ = (WrapMode)((ulong)*plVar9 >> 0x20);
          local_c0._0_8_ = (long *)*plVar5;
        }
        local_c0._8_4_ = (undefined4)plVar5[1];
        FStack_b4 = (FilterMode)((ulong)plVar5[1] >> 0x20);
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append(local_c0);
        local_e0 = &local_d0;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_d0 = *plVar9;
          lStack_c8 = plVar5[3];
        }
        else {
          local_d0 = *plVar9;
          local_e0 = (long *)*plVar5;
        }
        local_d8 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((undefined8 *)local_c0._0_8_ != &local_b0) {
          operator_delete((void *)local_c0._0_8_,CONCAT44(local_b0._4_4_,(WrapMode)local_b0) + 1);
        }
        if ((long *)CONCAT44(uStack_10c,local_110) != local_100) {
          operator_delete((long *)CONCAT44(uStack_10c,local_110),local_100[0] + 1);
        }
        local_c0._0_4_ = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_1_BIT;
        util::Texture2DArrayTestCaseParameters::Texture2DArrayTestCaseParameters
                  ((Texture2DArrayTestCaseParameters *)(local_c0 + 8));
        local_b0._0_4_ = (WrapMode)local_f0->m_testCtx;
        local_b0._4_4_ = (WrapMode)((ulong)local_f0->m_testCtx >> 0x20);
        auStack_a0._0_4_ =
             *(undefined4 *)((long)&populateTextureShadowTests::formats[0].name + lVar7);
        local_c0._0_4_ = local_40->op;
        VStack_a8 = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
        uStack_a4 = 2;
        local_80 = 0x4000000020;
        local_78 = 8;
        local_110 = 0x1f;
        if (local_90._M_current == local_88) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(auStack_a0 + 8),local_90,(Program *)&local_110);
        }
        else {
          *local_90._M_current = PROGRAM_2D_ARRAY_SHADOW;
          local_90._M_current = local_90._M_current + 1;
        }
        pTVar6 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,(char *)local_e0,&local_121);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar6,local_e8,(char *)CONCAT44(uStack_10c,local_110),
                   (char *)local_70[0]);
        pTVar6->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d680f0;
        *(undefined4 *)&pTVar6[1]._vptr_TestNode = local_c0._0_4_;
        pTVar6[1].m_testCtx = (TestContext *)CONCAT44(FStack_b4,local_c0._8_4_);
        pTVar6[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(local_b0._4_4_,(WrapMode)local_b0);
        *(ulong *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(VStack_a8,local_b0._4_4_);
        *(ulong *)((long)&pTVar6[1].m_name._M_string_length + 4) =
             CONCAT44(auStack_a0._0_4_,uStack_a4);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               ((long)&pTVar6[1].m_name.field_2 + 8),
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (auStack_a0 + 8));
        pTVar6[1].m_description.field_2._M_allocated_capacity = local_80;
        *(undefined4 *)((long)&pTVar6[1].m_description.field_2 + 8) = local_78;
        tcu::TestNode::addChild(local_118,pTVar6);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if ((long *)CONCAT44(uStack_10c,local_110) != local_100) {
          operator_delete((long *)CONCAT44(uStack_10c,local_110),local_100[0] + 1);
        }
        if ((Program *)auStack_a0._8_8_ != (Program *)0x0) {
          operator_delete((void *)auStack_a0._8_8_,(long)local_88 - auStack_a0._8_8_);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,local_d0 + 1);
        }
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x68);
      lVar11 = local_48 + 1;
    } while (lVar11 != 8);
    tcu::TestNode::addChild(local_120,local_118);
    lVar11 = local_50 + 1;
  } while (lVar11 != 6);
  tcu::TestNode::addChild(local_38,local_120);
  return;
}

Assistant:

void populateTextureShadowTests (tcu::TestCaseGroup* textureShadowTests)
{
	tcu::TestContext&				testCtx				= textureShadowTests->getTestContext();

	static const struct
	{
		const char*		name;
		const VkFormat	format;
	} formats[] =
	{
		{ "d16_unorm",				VK_FORMAT_D16_UNORM				},
		{ "x8_d24_unorm_pack32",	VK_FORMAT_X8_D24_UNORM_PACK32	},
		{ "d32_sfloat",				VK_FORMAT_D32_SFLOAT			},
		{ "d16_unorm_s8_uint",		VK_FORMAT_D16_UNORM_S8_UINT		},
		{ "d24_unorm_s8_uint",		VK_FORMAT_D24_UNORM_S8_UINT		},
		{ "d32_sfloat_s8_uint",		VK_FORMAT_D32_SFLOAT_S8_UINT	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	minFilter;
		const Sampler::FilterMode	magFilter;
	} filters[] =
	{
		{ "nearest",				Sampler::NEAREST,					Sampler::NEAREST	},
		{ "linear",					Sampler::LINEAR,					Sampler::LINEAR		},
		{ "nearest_mipmap_nearest",	Sampler::NEAREST_MIPMAP_NEAREST,	Sampler::LINEAR		},
		{ "linear_mipmap_nearest",	Sampler::LINEAR_MIPMAP_NEAREST,		Sampler::LINEAR		},
		{ "nearest_mipmap_linear",	Sampler::NEAREST_MIPMAP_LINEAR,		Sampler::LINEAR		},
		{ "linear_mipmap_linear",	Sampler::LINEAR_MIPMAP_LINEAR,		Sampler::LINEAR		}
	};

	static const struct
	{
		const char*					name;
		const Sampler::CompareMode	op;
	} compareOp[] =
	{
		{ "less_or_equal",		Sampler::COMPAREMODE_LESS_OR_EQUAL		},
		{ "greater_or_equal",	Sampler::COMPAREMODE_GREATER_OR_EQUAL	},
		{ "less",				Sampler::COMPAREMODE_LESS				},
		{ "greater",			Sampler::COMPAREMODE_GREATER			},
		{ "equal",				Sampler::COMPAREMODE_EQUAL				},
		{ "not_equal",			Sampler::COMPAREMODE_NOT_EQUAL			},
		{ "always",				Sampler::COMPAREMODE_ALWAYS				},
		{ "never",				Sampler::COMPAREMODE_NEVER				}
	};

	// 2D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2D	(new tcu::TestCaseGroup(testCtx, "2d", "2D texture shadow lookup tests"));

		for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(filters); filterNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup>	filterGroup	(new tcu::TestCaseGroup(testCtx, filters[filterNdx].name, ""));

			for (int compareNdx = 0; compareNdx < DE_LENGTH_OF_ARRAY(compareOp); compareNdx++)
			{
				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const string						name			= string(compareOp[compareNdx].name) + "_" + formats[formatNdx].name;
					Texture2DShadowTestCaseParameters	testParameters;

					testParameters.minFilter	= filters[filterNdx].minFilter;
					testParameters.magFilter	= filters[filterNdx].magFilter;
					testParameters.format		= formats[formatNdx].format;
					testParameters.compareOp	= compareOp[compareNdx].op;
					testParameters.wrapS		= Sampler::REPEAT_GL;
					testParameters.wrapT		= Sampler::REPEAT_GL;
					testParameters.width		= 32;
					testParameters.height		= 64;

					testParameters.programs.push_back(PROGRAM_2D_SHADOW);

					filterGroup->addChild(new TextureTestCase<Texture2DShadowTestInstance>(testCtx, name.c_str(), "", testParameters));
				}
			}

			group2D->addChild(filterGroup.release());
		}

		textureShadowTests->addChild(group2D.release());
	}

	// Cubemap cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	groupCube	(new tcu::TestCaseGroup(testCtx, "cube", "Cube map texture shadow lookup tests"));

		for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(filters); filterNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup>	filterGroup	(new tcu::TestCaseGroup(testCtx, filters[filterNdx].name, ""));

			for (int compareNdx = 0; compareNdx < DE_LENGTH_OF_ARRAY(compareOp); compareNdx++)
			{
				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const string							name			= string(compareOp[compareNdx].name) + "_" + formats[formatNdx].name;
					TextureCubeShadowTestCaseParameters		testParameters;

					testParameters.minFilter	= filters[filterNdx].minFilter;
					testParameters.magFilter	= filters[filterNdx].magFilter;
					testParameters.format		= formats[formatNdx].format;
					testParameters.compareOp	= compareOp[compareNdx].op;
					testParameters.wrapS		= Sampler::REPEAT_GL;
					testParameters.wrapT		= Sampler::REPEAT_GL;
					testParameters.size			= 32;

					testParameters.programs.push_back(PROGRAM_CUBE_SHADOW);

					filterGroup->addChild(new TextureTestCase<TextureCubeShadowTestInstance>(testCtx, name.c_str(), "", testParameters));
				}
			}

			groupCube->addChild(filterGroup.release());
		}

		textureShadowTests->addChild(groupCube.release());
	}

	// 2D array cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2DArray	(new tcu::TestCaseGroup(testCtx, "2d_array", "2D texture array shadow lookup tests"));

		for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(filters); filterNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup>	filterGroup	(new tcu::TestCaseGroup(testCtx, filters[filterNdx].name, ""));

			for (int compareNdx = 0; compareNdx < DE_LENGTH_OF_ARRAY(compareOp); compareNdx++)
			{
				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const string							name			= string(compareOp[compareNdx].name) + "_" + formats[formatNdx].name;
					Texture2DArrayShadowTestCaseParameters	testParameters;

					testParameters.minFilter	= filters[filterNdx].minFilter;
					testParameters.magFilter	= filters[filterNdx].magFilter;
					testParameters.format		= formats[formatNdx].format;
					testParameters.compareOp	= compareOp[compareNdx].op;
					testParameters.wrapS		= Sampler::REPEAT_GL;
					testParameters.wrapT		= Sampler::REPEAT_GL;
					testParameters.width		= 32;
					testParameters.height		= 64;
					testParameters.numLayers	= 8;

					testParameters.programs.push_back(PROGRAM_2D_ARRAY_SHADOW);

					filterGroup->addChild(new TextureTestCase<Texture2DArrayShadowTestInstance>(testCtx, name.c_str(), "", testParameters));
				}
			}

			group2DArray->addChild(filterGroup.release());
		}

		textureShadowTests->addChild(group2DArray.release());
	}
}